

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuPixelFormat.hpp
# Opt level: O0

int tcu::PixelFormat::convertChannel(int val,int bits)

{
  int iVar1;
  int c;
  int bits_local;
  int val_local;
  
  if (bits == 1) {
    bits_local = 0;
    if ((val & 0x80U) != 0) {
      bits_local = 0xff;
    }
  }
  else {
    iVar1 = val >> (8U - (char)bits & 0x1f);
    bits_local = iVar1 << (8U - (char)bits & 0x1f) | iVar1 >> ((char)(bits << 1) - 8U & 0x1f);
  }
  return bits_local;
}

Assistant:

static inline int convertChannel (int val, int bits)
	{
		if (bits == 1)
			return (val & 0x80) ? 0xff : 0;
		else
		{
			DE_ASSERT(deInRange32(bits, 4, 8));
			int c = val >> (8-bits);
			return (c << (8-bits)) | (c >> (2*bits-8));
		}
	}